

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

bool __thiscall
pybind11::detail::list_caster<std::vector<double,_std::allocator<double>_>,_double>::load
          (list_caster<std::vector<double,_std::allocator<double>_>,_double> *this,handle src,
          bool convert)

{
  handle h;
  bool bVar1;
  undefined1 uVar2;
  It *in_RDI;
  value_conv conv;
  reference it;
  sequence_iterator __end3;
  sequence_iterator __begin3;
  sequence *__range3;
  sequence s;
  It *in_stack_fffffffffffffef8;
  handle in_stack_ffffffffffffff00;
  undefined5 in_stack_ffffffffffffff08;
  byte in_stack_ffffffffffffff0d;
  undefined1 in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  list_caster<std::vector<double,_std::allocator<double>_>,_double> *in_stack_ffffffffffffff10;
  It *pIVar3;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  handle in_stack_ffffffffffffff48;
  byte local_1;
  
  bVar1 = isinstance<pybind11::sequence,_0>(in_stack_ffffffffffffff00);
  if ((!bVar1) || (bVar1 = isinstance<pybind11::str,_0>(in_stack_ffffffffffffff00), bVar1)) {
    local_1 = 0;
  }
  else {
    h.m_ptr._5_1_ = in_stack_ffffffffffffff0d;
    h.m_ptr._0_5_ = in_stack_ffffffffffffff08;
    h.m_ptr._6_1_ = in_stack_ffffffffffffff0e;
    h.m_ptr._7_1_ = in_stack_ffffffffffffff0f;
    reinterpret_borrow<pybind11::sequence>(h);
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x3d7f06);
    sequence::sequence((sequence *)in_stack_ffffffffffffff00.m_ptr,
                       (sequence *)in_stack_fffffffffffffef8);
    reserve_maybe<std::vector<double,_std::allocator<double>_>,_0>
              (in_stack_ffffffffffffff10,
               (sequence *)
               CONCAT17(in_stack_ffffffffffffff0f,
                        CONCAT16(in_stack_ffffffffffffff0e,
                                 CONCAT15(in_stack_ffffffffffffff0d,in_stack_ffffffffffffff08))),
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff00.m_ptr);
    sequence::~sequence((sequence *)0x3d7f3e);
    sequence::begin((sequence *)in_stack_ffffffffffffff00.m_ptr);
    sequence::end((sequence *)in_stack_ffffffffffffff00.m_ptr);
    while (uVar2 = detail::operator!=((It *)in_stack_ffffffffffffff00.m_ptr,
                                      in_stack_fffffffffffffef8), (bool)uVar2) {
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator*
                (in_stack_fffffffffffffef8);
      accessor::operator_cast_to_object
                ((accessor<pybind11::detail::accessor_policies::sequence_item> *)
                 CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff0e,
                                         CONCAT15(in_stack_ffffffffffffff0d,
                                                  in_stack_ffffffffffffff08))));
      in_stack_ffffffffffffff0e =
           type_caster<double,_void>::load
                     ((type_caster<double,_void> *)
                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                      in_stack_ffffffffffffff48,SUB81((ulong)in_RDI >> 0x38,0));
      in_stack_ffffffffffffff0d = in_stack_ffffffffffffff0e ^ 0xff;
      object::~object((object *)0x3d803f);
      bVar1 = (in_stack_ffffffffffffff0d & 1) != 0;
      if (bVar1) {
        local_1 = 0;
      }
      else {
        pIVar3 = in_RDI;
        in_stack_ffffffffffffff00.m_ptr =
             (PyObject *)cast_op<double&&>((make_caster<double_&&> *)0x3d80e9);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff00.m_ptr,
                   (value_type_conflict3 *)in_RDI);
        in_stack_fffffffffffffef8 = in_RDI;
        in_RDI = pIVar3;
      }
      in_stack_ffffffffffffff44 = (uint)bVar1;
      accessor<pybind11::detail::accessor_policies::sequence_item>::~accessor
                ((accessor<pybind11::detail::accessor_policies::sequence_item> *)0x3d8112);
      if (in_stack_ffffffffffffff44 != 0) goto LAB_003d814e;
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator++
                ((generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite> *)
                 in_stack_ffffffffffffff00.m_ptr);
    }
    local_1 = 1;
LAB_003d814e:
    sequence::~sequence((sequence *)0x3d815b);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }